

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<int> * __thiscall QList<int>::mid(QList<int> *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  QArrayDataPointer<int> *other;
  const_pointer piVar2;
  long in_RDX;
  long in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  DataPointer copied;
  qsizetype l;
  qsizetype p;
  QList<int> *in_stack_ffffffffffffff68;
  QList<int> *in_stack_ffffffffffffff70;
  QArrayDataPointer<int> *this_00;
  QList<int> *this_01;
  undefined4 in_stack_ffffffffffffff90;
  QArrayDataPointer<int> local_30;
  qsizetype local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  local_10 = in_RDX;
  CVar1 = QtPrivate::QContainerImplHelper::mid(*(qsizetype *)(in_RSI + 0x10),&local_10,&local_18);
  if (CVar1 < Full) {
    memset(in_RDI,0,0x18);
    QList((QList<int> *)0x57df28);
  }
  else if (CVar1 == Full) {
    QList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_30.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<int>::QArrayDataPointer
              ((QArrayDataPointer<int> *)CONCAT44(CVar1,in_stack_ffffffffffffff90),in_RSI,
               (qsizetype)this_01,(AllocationOption)((ulong)in_RDI >> 0x20));
    other = (QArrayDataPointer<int> *)QArrayDataPointer<int>::operator->(&local_30);
    piVar2 = data((QList<int> *)0x57df9a);
    this_00 = (QArrayDataPointer<int> *)(piVar2 + local_10);
    data((QList<int> *)0x57dfb8);
    QtPrivate::QPodArrayOps<int>::copyAppend
              ((QPodArrayOps<int> *)this_01,(int *)in_RDI,(int *)this_00);
    QArrayDataPointer<int>::QArrayDataPointer(this_00,other);
    QList((QList<int> *)this_00,other);
    QArrayDataPointer<int>::~QArrayDataPointer(this_00);
    QArrayDataPointer<int>::~QArrayDataPointer(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}